

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O1

void __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
::set_main_paging(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>_>
                  *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Region RVar10;
  
  bVar1 = (this->main_state_).base.read;
  bVar2 = (this->main_state_).base.write;
  bVar3 = (this->main_state_).region_04_08.read;
  bVar4 = (this->main_state_).region_04_08.write;
  bVar5 = (this->main_state_).region_20_40.read;
  bVar6 = (this->main_state_).region_20_40.write;
  bVar7 = (this->switches_).read_auxiliary_memory;
  bVar8 = (this->switches_).write_auxiliary_memory;
  (this->main_state_).base.read = bVar7;
  (this->main_state_).base.write = bVar8;
  if ((this->switches_).store_80 == true) {
    bVar8 = (this->switches_).video_page_2;
    bVar9 = (this->switches_).high_resolution;
    (this->main_state_).region_04_08.write = bVar8;
    (this->main_state_).region_04_08.read = bVar8;
    if (bVar9 == true) {
      (this->main_state_).region_20_40.write = bVar8;
      (this->main_state_).region_20_40.read = bVar8;
    }
    else {
      (this->main_state_).region_20_40 = (this->main_state_).base;
    }
  }
  else {
    RVar10 = (this->main_state_).base;
    (this->main_state_).region_20_40 = RVar10;
    (this->main_state_).region_04_08 = RVar10;
  }
  if ((((bVar1 == bVar7) && (bVar2 == (this->main_state_).base.write)) &&
      (bVar3 == (this->main_state_).region_04_08.read)) &&
     (((bVar4 == (this->main_state_).region_04_08.write &&
       (bVar5 == (this->main_state_).region_20_40.read)) &&
      (bVar6 == (this->main_state_).region_20_40.write)))) {
    return;
  }
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_true>::set_paging<1>(this->machine_);
  return;
}

Assistant:

void set_main_paging() {
			const auto previous_state = main_state_;

			// The two appropriately named switches provide the base case.
			main_state_.base.read = switches_.read_auxiliary_memory;
			main_state_.base.write = switches_.write_auxiliary_memory;

			if(switches_.store_80) {
				// If store 80 is set, use the page 2 flag for the lower carve out;
				// if both store 80 and high resolution are set, use the page 2 flag for both carve outs.
				main_state_.region_04_08.read = main_state_.region_04_08.write = switches_.video_page_2;

				if(switches_.high_resolution) {
					main_state_.region_20_40.read = main_state_.region_20_40.write = switches_.video_page_2;
				} else {
					main_state_.region_20_40 = main_state_.base;
				}
			} else {
				main_state_.region_04_08 = main_state_.region_20_40 = main_state_.base;
			}

			if(previous_state != main_state_) {
				machine_.template set_paging<PagingType::Main>();
			}
		}